

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

ImDrawCmd * __thiscall
ImVector<ImDrawCmd>::insert(ImVector<ImDrawCmd> *this,ImDrawCmd *it,ImDrawCmd *v)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ImTextureID pvVar4;
  undefined8 uVar5;
  ImDrawCallback p_Var6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int new_capacity;
  ImDrawCmd *pIVar11;
  
  pIVar11 = this->Data;
  lVar10 = (long)it - (long)pIVar11;
  iVar9 = this->Size;
  if (iVar9 == this->Capacity) {
    if (iVar9 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar9 / 2 + iVar9;
    }
    new_capacity = iVar9 + 1;
    if (iVar9 + 1 < iVar7) {
      new_capacity = iVar7;
    }
    reserve(this,new_capacity);
    iVar9 = this->Size;
    pIVar11 = this->Data;
  }
  lVar8 = (long)iVar9 - lVar10 / 0x38;
  if (lVar8 != 0 && lVar10 / 0x38 <= (long)iVar9) {
    memmove((void *)((long)pIVar11 + lVar10 + 0x38),(void *)((long)pIVar11 + lVar10),lVar8 * 0x38);
    pIVar11 = this->Data;
  }
  *(void **)((long)pIVar11 + lVar10 + 0x30) = v->UserCallbackData;
  uVar2 = *(undefined8 *)&v->ClipRect;
  uVar3 = *(undefined8 *)&(v->ClipRect).z;
  pvVar4 = v->TextureId;
  uVar5 = *(undefined8 *)&v->VtxOffset;
  p_Var6 = v->UserCallback;
  puVar1 = (undefined8 *)((long)pIVar11 + lVar10 + 0x20);
  *puVar1 = *(undefined8 *)&v->ElemCount;
  puVar1[1] = p_Var6;
  puVar1 = (undefined8 *)((long)pIVar11 + lVar10 + 0x10);
  *puVar1 = pvVar4;
  puVar1[1] = uVar5;
  *(undefined8 *)((long)pIVar11 + lVar10) = uVar2;
  ((undefined8 *)((long)pIVar11 + lVar10))[1] = uVar3;
  this->Size = this->Size + 1;
  return (ImDrawCmd *)(lVar10 + (long)this->Data);
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }